

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void configure_static_seg_features(AV1_COMP *cpi)

{
  uint uVar1;
  int iVar2;
  long *in_RDI;
  int qi_delta;
  int high_q;
  double avg_q;
  segmentation *seg;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  aom_bit_depth_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  double qstart;
  RATE_CONTROL *rc_00;
  
  rc_00 = (RATE_CONTROL *)(in_RDI + 0x8137);
  qstart = *(double *)(*in_RDI + 0xacf0);
  uVar1 = (uint)(48.0 < qstart);
  if ((char)in_RDI[0x77f0] == '\0') {
    memset((void *)in_RDI[0xe253],0,(long)(*(int *)((long)in_RDI + 0x3c194) * (int)in_RDI[0x7833]));
    *(uint8_t *)((long)&rc_00->base_frame_target + 1) = '\0';
    *(uint8_t *)((long)&rc_00->base_frame_target + 2) = '\0';
    av1_disable_segmentation((segmentation *)rc_00);
    av1_clearall_segfeatures((segmentation *)0x23210d);
  }
  else if ((*(byte *)((long)in_RDI + 0x42d7a) & 1) == 0) {
    if ((uint8_t)rc_00->base_frame_target != '\0') {
      if (*(int *)((long)in_RDI + 0x60784) == 0) {
        av1_disable_segmentation((segmentation *)rc_00);
        memset((void *)in_RDI[0xe253],0,
               (long)(*(int *)((long)in_RDI + 0x3c194) * (int)in_RDI[0x7833]));
        *(uint8_t *)((long)&rc_00->base_frame_target + 1) = '\0';
        *(uint8_t *)((long)&rc_00->base_frame_target + 2) = '\0';
        av1_clearall_segfeatures((segmentation *)0x232310);
      }
      else if ((int)in_RDI[0xc0f5] == 0) {
        *(undefined1 *)((long)in_RDI + 0x409b9) = 0;
        *(undefined1 *)((long)in_RDI + 0x409ba) = 0;
      }
      else {
        av1_enable_segfeature((segmentation *)rc_00,0,'\x05');
        av1_enable_segfeature((segmentation *)rc_00,1,'\x05');
        av1_clear_segdata((segmentation *)rc_00,0,'\x05');
        av1_set_segdata((segmentation *)rc_00,0,'\x05',7);
        av1_clear_segdata((segmentation *)rc_00,1,'\x05');
        av1_set_segdata((segmentation *)rc_00,1,'\x05',7);
        if (uVar1 != 0) {
          av1_enable_segfeature((segmentation *)rc_00,0,'\x06');
          av1_enable_segfeature((segmentation *)rc_00,1,'\x06');
        }
        *(undefined1 *)((long)&rc_00->base_frame_target + 2) = 1;
      }
    }
  }
  else {
    memset((void *)in_RDI[0xe253],0,(long)(*(int *)((long)in_RDI + 0x3c194) * (int)in_RDI[0x7833]));
    *(uint8_t *)((long)&rc_00->base_frame_target + 1) = '\0';
    *(uint8_t *)((long)&rc_00->base_frame_target + 2) = '\0';
    av1_disable_segmentation((segmentation *)rc_00);
    av1_clearall_segfeatures((segmentation *)0x232177);
    if ((char)rc_00->base_frame_target != '\0') {
      *(undefined1 *)((long)&rc_00->base_frame_target + 1) = 1;
      *(undefined1 *)((long)&rc_00->base_frame_target + 2) = 1;
      iVar2 = av1_compute_qdelta(rc_00,qstart,(double)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffcc);
      av1_set_segdata((segmentation *)rc_00,1,'\0',iVar2 + -2);
      av1_set_segdata((segmentation *)rc_00,1,'\x02',-2);
      av1_set_segdata((segmentation *)rc_00,1,'\x01',-2);
      av1_set_segdata((segmentation *)rc_00,1,'\x03',-2);
      av1_set_segdata((segmentation *)rc_00,1,'\x04',-2);
      av1_enable_segfeature((segmentation *)rc_00,1,'\x02');
      av1_enable_segfeature((segmentation *)rc_00,1,'\x01');
      av1_enable_segfeature((segmentation *)rc_00,1,'\x03');
      av1_enable_segfeature((segmentation *)rc_00,1,'\x04');
      av1_enable_segfeature((segmentation *)rc_00,1,'\0');
    }
  }
  return;
}

Assistant:

static void configure_static_seg_features(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;
  struct segmentation *const seg = &cm->seg;

  double avg_q;
#if CONFIG_FPMT_TEST
  avg_q = ((cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) &&
           (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE))
              ? cpi->ppi->p_rc.temp_avg_q
              : cpi->ppi->p_rc.avg_q;
#else
  avg_q = cpi->ppi->p_rc.avg_q;
#endif

  int high_q = (int)(avg_q > 48.0);
  int qi_delta;

  // Disable and clear down for KF
  if (cm->current_frame.frame_type == KEY_FRAME) {
    // Clear down the global segmentation map
    memset(cpi->enc_seg.map, 0, cm->mi_params.mi_rows * cm->mi_params.mi_cols);
    seg->update_map = 0;
    seg->update_data = 0;

    // Disable segmentation
    av1_disable_segmentation(seg);

    // Clear down the segment features.
    av1_clearall_segfeatures(seg);
  } else if (cpi->refresh_frame.alt_ref_frame) {
    // If this is an alt ref frame
    // Clear down the global segmentation map
    memset(cpi->enc_seg.map, 0, cm->mi_params.mi_rows * cm->mi_params.mi_cols);
    seg->update_map = 0;
    seg->update_data = 0;

    // Disable segmentation and individual segment features by default
    av1_disable_segmentation(seg);
    av1_clearall_segfeatures(seg);

    // If segmentation was enabled set those features needed for the
    // arf itself.
    if (seg->enabled) {
      seg->update_map = 1;
      seg->update_data = 1;

      qi_delta = av1_compute_qdelta(rc, avg_q, avg_q * 0.875,
                                    cm->seq_params->bit_depth);
      av1_set_segdata(seg, 1, SEG_LVL_ALT_Q, qi_delta - 2);
      av1_set_segdata(seg, 1, SEG_LVL_ALT_LF_Y_H, -2);
      av1_set_segdata(seg, 1, SEG_LVL_ALT_LF_Y_V, -2);
      av1_set_segdata(seg, 1, SEG_LVL_ALT_LF_U, -2);
      av1_set_segdata(seg, 1, SEG_LVL_ALT_LF_V, -2);

      av1_enable_segfeature(seg, 1, SEG_LVL_ALT_LF_Y_H);
      av1_enable_segfeature(seg, 1, SEG_LVL_ALT_LF_Y_V);
      av1_enable_segfeature(seg, 1, SEG_LVL_ALT_LF_U);
      av1_enable_segfeature(seg, 1, SEG_LVL_ALT_LF_V);

      av1_enable_segfeature(seg, 1, SEG_LVL_ALT_Q);
    }
  } else if (seg->enabled) {
    // All other frames if segmentation has been enabled

    // First normal frame in a valid gf or alt ref group
    if (rc->frames_since_golden == 0) {
      // Set up segment features for normal frames in an arf group
      // Disable segmentation and clear down features if alt ref
      // is not active for this group

      av1_disable_segmentation(seg);

      memset(cpi->enc_seg.map, 0,
             cm->mi_params.mi_rows * cm->mi_params.mi_cols);

      seg->update_map = 0;
      seg->update_data = 0;

      av1_clearall_segfeatures(seg);
    } else if (rc->is_src_frame_alt_ref) {
      // Special case where we are coding over the top of a previous
      // alt ref frame.
      // Segment coding disabled for compred testing

      // Enable ref frame features for segment 0 as well
      av1_enable_segfeature(seg, 0, SEG_LVL_REF_FRAME);
      av1_enable_segfeature(seg, 1, SEG_LVL_REF_FRAME);

      // All mbs should use ALTREF_FRAME
      av1_clear_segdata(seg, 0, SEG_LVL_REF_FRAME);
      av1_set_segdata(seg, 0, SEG_LVL_REF_FRAME, ALTREF_FRAME);
      av1_clear_segdata(seg, 1, SEG_LVL_REF_FRAME);
      av1_set_segdata(seg, 1, SEG_LVL_REF_FRAME, ALTREF_FRAME);

      // Skip all MBs if high Q (0,0 mv and skip coeffs)
      if (high_q) {
        av1_enable_segfeature(seg, 0, SEG_LVL_SKIP);
        av1_enable_segfeature(seg, 1, SEG_LVL_SKIP);
      }
      // Enable data update
      seg->update_data = 1;
    } else {
      // All other frames.

      // No updates.. leave things as they are.
      seg->update_map = 0;
      seg->update_data = 0;
    }
  }
}